

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym2612.c
# Opt level: O1

void Update_Chan_Algo3_LFO_Int(ym2612_ *YM2612,channel_ *CH,DEV_SMPL **buf,UINT32 length)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  
  if (length != 0 && CH->SLOT[3].Ecnt != 0x20000000) {
    uVar10 = 0;
    do {
      iVar7 = CH->SLOT[0].Fcnt;
      YM2612->in0 = iVar7;
      iVar2 = CH->SLOT[2].Fcnt;
      YM2612->in1 = iVar2;
      iVar3 = CH->SLOT[1].Fcnt;
      YM2612->in2 = iVar3;
      iVar4 = CH->SLOT[3].Fcnt;
      YM2612->in3 = iVar4;
      uVar8 = YM2612->LFO_FREQ_UP[uVar10] * CH->FMS;
      if (uVar8 < 0x200) {
        CH->SLOT[0].Fcnt = iVar7 + CH->SLOT[0].Finc;
        CH->SLOT[2].Fcnt = iVar2 + CH->SLOT[2].Finc;
        CH->SLOT[1].Fcnt = iVar3 + CH->SLOT[1].Finc;
        iVar7 = CH->SLOT[3].Finc;
      }
      else {
        iVar9 = (int)uVar8 >> 9;
        iVar5 = CH->SLOT[0].Finc;
        iVar6 = CH->SLOT[1].Finc;
        CH->SLOT[0].Fcnt = iVar7 + iVar5 + (iVar5 * iVar9 >> 9);
        iVar7 = CH->SLOT[2].Finc;
        CH->SLOT[2].Fcnt = iVar2 + iVar7 + (iVar7 * iVar9 >> 9);
        CH->SLOT[1].Fcnt = iVar3 + iVar6 + (iVar6 * iVar9 >> 9);
        iVar7 = CH->SLOT[3].Finc;
        iVar7 = (iVar9 * iVar7 >> 9) + iVar7;
      }
      CH->SLOT[3].Fcnt = iVar7 + iVar4;
      iVar7 = YM2612->LFO_ENV_UP[uVar10];
      if ((CH->SLOT[0].SEG & 4) == 0) {
        YM2612->en0 = (iVar7 >> ((byte)CH->SLOT[0].AMS & 0x1f)) +
                      CH->SLOT[0].TLL + ENV_TAB[*(short *)((long)&CH->SLOT[0].Ecnt + 2)];
      }
      else {
        uVar8 = CH->SLOT[0].TLL + ENV_TAB[*(short *)((long)&CH->SLOT[0].Ecnt + 2)];
        YM2612->en0 = uVar8;
        if ((int)uVar8 < 0x1000) {
          YM2612->en0 = (iVar7 >> ((byte)CH->SLOT[0].AMS & 0x1f)) + (uVar8 ^ 0xfff);
        }
        else {
          YM2612->en0 = 0;
        }
      }
      if ((CH->SLOT[2].SEG & 4) == 0) {
        YM2612->en1 = (iVar7 >> ((byte)CH->SLOT[2].AMS & 0x1f)) +
                      CH->SLOT[2].TLL + ENV_TAB[*(short *)((long)&CH->SLOT[2].Ecnt + 2)];
      }
      else {
        uVar8 = CH->SLOT[2].TLL + ENV_TAB[*(short *)((long)&CH->SLOT[2].Ecnt + 2)];
        YM2612->en1 = uVar8;
        if ((int)uVar8 < 0x1000) {
          YM2612->en1 = (iVar7 >> ((byte)CH->SLOT[2].AMS & 0x1f)) + (uVar8 ^ 0xfff);
        }
        else {
          YM2612->en1 = 0;
        }
      }
      if ((CH->SLOT[1].SEG & 4) == 0) {
        YM2612->en2 = (iVar7 >> ((byte)CH->SLOT[1].AMS & 0x1f)) +
                      CH->SLOT[1].TLL + ENV_TAB[*(short *)((long)&CH->SLOT[1].Ecnt + 2)];
      }
      else {
        uVar8 = CH->SLOT[1].TLL + ENV_TAB[*(short *)((long)&CH->SLOT[1].Ecnt + 2)];
        YM2612->en2 = uVar8;
        if ((int)uVar8 < 0x1000) {
          YM2612->en2 = (iVar7 >> ((byte)CH->SLOT[1].AMS & 0x1f)) + (uVar8 ^ 0xfff);
        }
        else {
          YM2612->en2 = 0;
        }
      }
      if ((CH->SLOT[3].SEG & 4) == 0) {
        bVar1 = (byte)CH->SLOT[3].AMS;
        uVar8 = ENV_TAB[*(short *)((long)&CH->SLOT[3].Ecnt + 2)] + CH->SLOT[3].TLL;
LAB_0013bdfd:
        YM2612->en3 = (iVar7 >> (bVar1 & 0x1f)) + uVar8;
      }
      else {
        uVar8 = ENV_TAB[*(short *)((long)&CH->SLOT[3].Ecnt + 2)] + CH->SLOT[3].TLL;
        YM2612->en3 = uVar8;
        if ((int)uVar8 < 0x1000) {
          bVar1 = (byte)CH->SLOT[3].AMS;
          uVar8 = uVar8 ^ 0xfff;
          goto LAB_0013bdfd;
        }
        YM2612->en3 = 0;
      }
      iVar7 = CH->SLOT[0].Ecnt + CH->SLOT[0].Einc;
      CH->SLOT[0].Ecnt = iVar7;
      if (CH->SLOT[0].Ecmp <= iVar7) {
        (*ENV_NEXT_EVENT[CH->SLOT[0].Ecurp])(YM2612,CH->SLOT);
      }
      iVar7 = CH->SLOT[2].Ecnt + CH->SLOT[2].Einc;
      CH->SLOT[2].Ecnt = iVar7;
      if (CH->SLOT[2].Ecmp <= iVar7) {
        (*ENV_NEXT_EVENT[CH->SLOT[2].Ecurp])(YM2612,CH->SLOT + 2);
      }
      iVar7 = CH->SLOT[1].Ecnt + CH->SLOT[1].Einc;
      CH->SLOT[1].Ecnt = iVar7;
      if (CH->SLOT[1].Ecmp <= iVar7) {
        (*ENV_NEXT_EVENT[CH->SLOT[1].Ecurp])(YM2612,CH->SLOT + 1);
      }
      iVar7 = CH->SLOT[3].Ecnt + CH->SLOT[3].Einc;
      CH->SLOT[3].Ecnt = iVar7;
      if (CH->SLOT[3].Ecmp <= iVar7) {
        (*ENV_NEXT_EVENT[CH->SLOT[3].Ecurp])(YM2612,CH->SLOT + 3);
      }
      YM2612->in0 = YM2612->in0 + (CH->S0_OUT[1] + CH->S0_OUT[0] >> ((byte)CH->FB & 0x1f));
      iVar7 = CH->S0_OUT[0];
      CH->S0_OUT[1] = iVar7;
      CH->S0_OUT[0] =
           *(int *)(*(long *)((long)SIN_TAB + (ulong)((uint)YM2612->in0 >> 0xb & 0x7ff8)) +
                   (long)YM2612->en0 * 4);
      uVar8 = iVar7 + YM2612->in1;
      YM2612->in1 = uVar8;
      uVar8 = *(int *)(*(long *)((long)SIN_TAB + (ulong)((uint)YM2612->in2 >> 0xb & 0x7ff8)) +
                      (long)YM2612->en2 * 4) +
              *(int *)(*(long *)((long)SIN_TAB + (ulong)(uVar8 >> 0xb & 0x7ff8)) +
                      (long)YM2612->en1 * 4) + YM2612->in3;
      YM2612->in3 = uVar8;
      iVar7 = *(int *)(*(long *)((long)SIN_TAB + (ulong)(uVar8 >> 0xb & 0x7ff8)) +
                      (long)YM2612->en3 * 4) >> 0xf;
      CH->OUTd = iVar7;
      uVar8 = YM2612->Inter_Cnt + YM2612->Inter_Step;
      YM2612->Inter_Cnt = uVar8;
      if ((uVar8 >> 0xe & 1) != 0) {
        uVar8 = uVar8 & 0x3fff;
        YM2612->Inter_Cnt = uVar8;
        uVar8 = uVar8 * CH->Old_OUTd + (uVar8 ^ 0x3fff) * iVar7 >> 0xe;
        CH->Old_OUTd = uVar8;
        (*buf)[uVar10] = (*buf)[uVar10] + (uVar8 & CH->LEFT);
        buf[1][uVar10] = buf[1][uVar10] + (CH->RIGHT & CH->Old_OUTd);
        uVar10 = (ulong)((int)uVar10 + 1);
      }
      CH->Old_OUTd = CH->OUTd;
    } while ((uint)uVar10 < length);
  }
  return;
}

Assistant:

static void Update_Chan_Algo3_LFO_Int(ym2612_ *YM2612, channel_ *CH, DEV_SMPL **buf, UINT32 length)
{
  UINT32 i;
  int env_LFO, freq_LFO;

  if (CH->SLOT[S3].Ecnt == ENV_END)
    return;

#if YM_DEBUG_LEVEL > 1
  fprintf(debug_file, "\n\nAlgo 3 LFO len = %d\n\n", length);
#endif

  for (i = 0; i < length; i++)
  {
    GET_CURRENT_PHASE
    UPDATE_PHASE_LFO
    GET_CURRENT_ENV_LFO
    UPDATE_ENV
    DO_ALGO_3
    DO_OUTPUT_INT
  }
}